

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Bool keyeq(KEY s1,KEY s2)

{
  char *local_20;
  KEY s2_local;
  KEY s1_local;
  
  local_20 = s2;
  s2_local = s1;
  while( true ) {
    if (*s2_local != *local_20) {
      return '\0';
    }
    if (*s2_local == '\0') break;
    s2_local = s2_local + 1;
    local_20 = local_20 + 1;
  }
  return '\x01';
}

Assistant:

static XML_Bool FASTCALL
keyeq(KEY s1, KEY s2) {
  for (; *s1 == *s2; s1++, s2++)
    if (*s1 == 0)
      return XML_TRUE;
  return XML_FALSE;
}